

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000194320 = 0x2d2d2d2d2d2d2d;
    uRam0000000000194327._0_1_ = '-';
    uRam0000000000194327._1_1_ = '-';
    uRam0000000000194327._2_1_ = '-';
    uRam0000000000194327._3_1_ = '-';
    uRam0000000000194327._4_1_ = '-';
    uRam0000000000194327._5_1_ = '-';
    uRam0000000000194327._6_1_ = '-';
    uRam0000000000194327._7_1_ = '-';
    DAT_00194310 = '-';
    DAT_00194310_1._0_1_ = '-';
    DAT_00194310_1._1_1_ = '-';
    DAT_00194310_1._2_1_ = '-';
    DAT_00194310_1._3_1_ = '-';
    DAT_00194310_1._4_1_ = '-';
    DAT_00194310_1._5_1_ = '-';
    DAT_00194310_1._6_1_ = '-';
    uRam0000000000194318 = 0x2d2d2d2d2d2d2d;
    DAT_0019431f = 0x2d;
    DAT_00194300 = '-';
    DAT_00194300_1._0_1_ = '-';
    DAT_00194300_1._1_1_ = '-';
    DAT_00194300_1._2_1_ = '-';
    DAT_00194300_1._3_1_ = '-';
    DAT_00194300_1._4_1_ = '-';
    DAT_00194300_1._5_1_ = '-';
    DAT_00194300_1._6_1_ = '-';
    uRam0000000000194308._0_1_ = '-';
    uRam0000000000194308._1_1_ = '-';
    uRam0000000000194308._2_1_ = '-';
    uRam0000000000194308._3_1_ = '-';
    uRam0000000000194308._4_1_ = '-';
    uRam0000000000194308._5_1_ = '-';
    uRam0000000000194308._6_1_ = '-';
    uRam0000000000194308._7_1_ = '-';
    DAT_001942f0 = '-';
    DAT_001942f0_1._0_1_ = '-';
    DAT_001942f0_1._1_1_ = '-';
    DAT_001942f0_1._2_1_ = '-';
    DAT_001942f0_1._3_1_ = '-';
    DAT_001942f0_1._4_1_ = '-';
    DAT_001942f0_1._5_1_ = '-';
    DAT_001942f0_1._6_1_ = '-';
    uRam00000000001942f8._0_1_ = '-';
    uRam00000000001942f8._1_1_ = '-';
    uRam00000000001942f8._2_1_ = '-';
    uRam00000000001942f8._3_1_ = '-';
    uRam00000000001942f8._4_1_ = '-';
    uRam00000000001942f8._5_1_ = '-';
    uRam00000000001942f8._6_1_ = '-';
    uRam00000000001942f8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001942e8._0_1_ = '-';
    uRam00000000001942e8._1_1_ = '-';
    uRam00000000001942e8._2_1_ = '-';
    uRam00000000001942e8._3_1_ = '-';
    uRam00000000001942e8._4_1_ = '-';
    uRam00000000001942e8._5_1_ = '-';
    uRam00000000001942e8._6_1_ = '-';
    uRam00000000001942e8._7_1_ = '-';
    DAT_0019432f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}